

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DividerClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DividerClauseSyntax,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Token divide;
  Token value;
  DividerClauseSyntax *this_00;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (DividerClauseSyntax *)allocate(this,0x30,8);
  divide.kind = args->kind;
  divide._2_1_ = args->field_0x2;
  divide.numFlags.raw = (args->numFlags).raw;
  divide.rawLen = args->rawLen;
  divide.info = args->info;
  value.kind = args_1->kind;
  value._2_1_ = args_1->field_0x2;
  value.numFlags.raw = (args_1->numFlags).raw;
  value.rawLen = args_1->rawLen;
  value.info = args_1->info;
  slang::syntax::DividerClauseSyntax::DividerClauseSyntax(this_00,divide,value);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }